

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_or_null_simplification.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::TryRewriteEqualOrIsNull(duckdb *this,Expression *equal_expr,Expression *and_expr)

{
  pointer puVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  BoundComparisonExpression *pBVar5;
  BoundConjunctionExpression *pBVar6;
  type pEVar7;
  BoundOperatorExpression *pBVar8;
  reference this_00;
  byte bVar9;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *item;
  pointer this_01;
  ExpressionType local_59;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_50;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_48;
  type local_40;
  undefined8 local_38;
  
  if (((equal_expr->super_BaseExpression).type == COMPARE_BOUNDARY_START) &&
     ((and_expr->super_BaseExpression).type == CONJUNCTION_AND)) {
    pBVar5 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                       (&equal_expr->super_BaseExpression);
    pBVar6 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                       (&and_expr->super_BaseExpression);
    if ((long)(pBVar6->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pBVar6->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      local_50 = &pBVar5->left;
      local_58._M_head_impl = (Expression *)this;
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                (local_50);
      local_48 = &pBVar5->right;
      local_40 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(local_48);
      puVar1 = (pBVar6->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar9 = 0;
      bVar2 = 0;
      for (this_01 = (pBVar6->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1;
          this_01 = this_01 + 1) {
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this_01);
        this = (duckdb *)local_58;
        if ((pEVar7->super_BaseExpression).type != OPERATOR_IS_NULL) goto LAB_01240197;
        pBVar8 = BaseExpression::Cast<duckdb::BoundOperatorExpression>
                           (&pEVar7->super_BaseExpression);
        this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(&pBVar8->children,0);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this_00);
        iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[10])(pEVar7);
        bVar3 = 1;
        if ((char)iVar4 == '\0') {
          iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[10])(pEVar7);
          bVar9 = 1;
          this = (duckdb *)local_58;
          bVar3 = bVar2;
          if ((char)iVar4 == '\0') goto LAB_01240197;
        }
        bVar2 = bVar3;
      }
      this = (duckdb *)local_58._M_head_impl;
      if ((bool)(bVar2 & bVar9)) {
        local_59 = COMPARE_BOUNDARY_END;
        make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((duckdb *)&local_38,&local_59,local_50,local_48);
        *(undefined8 *)local_58._M_head_impl = local_38;
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               local_58._M_head_impl;
      }
    }
  }
LAB_01240197:
  (((Expression *)this)->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

static unique_ptr<Expression> TryRewriteEqualOrIsNull(Expression &equal_expr, Expression &and_expr) {
	if (equal_expr.GetExpressionType() != ExpressionType::COMPARE_EQUAL ||
	    and_expr.GetExpressionType() != ExpressionType::CONJUNCTION_AND) {
		return nullptr;
	}

	auto &equal_cast = equal_expr.Cast<BoundComparisonExpression>();
	auto &and_cast = and_expr.Cast<BoundConjunctionExpression>();

	if (and_cast.children.size() != 2) {
		return nullptr;
	}

	// Make sure on the AND conjunction the relevant conditions appear
	auto &a_exp = *equal_cast.left;
	auto &b_exp = *equal_cast.right;
	bool a_is_null_found = false;
	bool b_is_null_found = false;

	for (const auto &item : and_cast.children) {
		auto &next_exp = *item;

		if (next_exp.GetExpressionType() == ExpressionType::OPERATOR_IS_NULL) {
			auto &next_exp_cast = next_exp.Cast<BoundOperatorExpression>();
			auto &child = *next_exp_cast.children[0];

			// Test for equality on both 'a' and 'b' expressions
			if (Expression::Equals(child, a_exp)) {
				a_is_null_found = true;
			} else if (Expression::Equals(child, b_exp)) {
				b_is_null_found = true;
			} else {
				return nullptr;
			}
		} else {
			return nullptr;
		}
	}
	if (a_is_null_found && b_is_null_found) {
		return make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_NOT_DISTINCT_FROM,
		                                            std::move(equal_cast.left), std::move(equal_cast.right));
	}
	return nullptr;
}